

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MicroString::SetUnowned
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  LargeRepKind LVar1;
  
  if ((arena == (Arena *)0x0) && (((ulong)this->rep_ & 3) != 0)) {
    DestroySlow(this);
  }
  this->rep_ = (void *)((ulong)unowned_input | 1);
  LVar1 = large_rep_kind(this);
  if (LVar1 == kUnowned) {
    return;
  }
  SetUnowned();
}

Assistant:

void MicroString::SetUnowned(const UnownedPayload& unowned_input,
                             Arena* arena) {
  if (arena == nullptr) Destroy();
  rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(&unowned_input) |
                                 kIsLargeRepTag);
  ABSL_DCHECK_EQ(+large_rep_kind(), +kUnowned);
}